

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

bool __thiscall Poonam::string_id::map_database::insert(map_database *this,hash_type hash,char *str)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  long *plVar6;
  bool bVar7;
  char *local_20;
  hash_type local_18;
  
  uVar4 = hash % *(ulong *)&this->field_0x10;
  plVar1 = *(long **)(*(long *)&this->strings_ + uVar4 * 8);
  plVar5 = (long *)0x0;
  if ((plVar1 != (long *)0x0) && (plVar6 = (long *)*plVar1, plVar5 = plVar1, plVar6[1] != hash)) {
    while (plVar1 = (long *)*plVar6, plVar1 != (long *)0x0) {
      plVar5 = (long *)0x0;
      if (((ulong)plVar1[1] % *(ulong *)&this->field_0x10 != uVar4) ||
         (plVar5 = plVar6, plVar6 = plVar1, plVar1[1] == hash)) goto LAB_001033f7;
    }
    plVar5 = (long *)0x0;
  }
LAB_001033f7:
  if (plVar5 == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = *plVar5;
  }
  local_20 = str;
  local_18 = hash;
  if (lVar3 == 0) {
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long&,char_const*&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->strings_,&local_18,&local_20,str);
    bVar7 = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)(lVar3 + 0x10));
    bVar7 = iVar2 == 0;
  }
  return bVar7;
}

Assistant:

bool sid::map_database::insert(hash_type hash, const char* str) {
	auto iter = strings_.find(hash);
	if(iter != strings_.end())
		return iter->second == str;
	strings_.emplace(hash,str);
	return true;
}